

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readToken(OurReader *this,Token *token)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  byte *pbVar4;
  Location pCVar5;
  long lVar6;
  bool bVar7;
  byte *pbVar8;
  long lVar9;
  
  pbVar4 = (byte *)this->end_;
  pbVar8 = (byte *)this->current_;
  while (((pbVar8 != pbVar4 && ((ulong)*pbVar8 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
    pbVar8 = pbVar8 + 1;
    this->current_ = (Location)pbVar8;
  }
  token->start_ = (Location)pbVar8;
  if (pbVar8 == pbVar4) {
LAB_0010f536:
    token->type_ = tokenEndOfStream;
    goto LAB_0010f6ec;
  }
  pbVar1 = pbVar8 + 1;
  this->current_ = (Location)pbVar1;
  bVar3 = *pbVar8;
  if (0x5a < bVar3) {
    if (bVar3 < 0x6e) {
      if (bVar3 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_0010f6ec;
      }
      if (bVar3 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_0010f6ec;
      }
      if ((bVar3 == 0x66) && (token->type_ = tokenFalse, 3 < (long)pbVar4 - (long)pbVar1)) {
        lVar9 = 4;
        do {
          if (lVar9 == 0) {
            pbVar8 = pbVar8 + 5;
            goto LAB_0010f711;
          }
          pbVar4 = pbVar8 + lVar9;
          pbVar1 = (byte *)("false" + lVar9);
          lVar9 = lVar9 + -1;
        } while (*pbVar4 == *pbVar1);
      }
    }
    else if (bVar3 < 0x7b) {
      if (bVar3 == 0x6e) {
        token->type_ = tokenNull;
        if (2 < (long)pbVar4 - (long)pbVar1) {
          lVar9 = 3;
          do {
            if (lVar9 == 0) goto LAB_0010f696;
            pbVar4 = pbVar8 + lVar9;
            pbVar1 = (byte *)("null" + lVar9);
            lVar9 = lVar9 + -1;
          } while (*pbVar4 == *pbVar1);
        }
      }
      else if ((bVar3 == 0x74) && (token->type_ = tokenTrue, 2 < (long)pbVar4 - (long)pbVar1)) {
        lVar9 = 3;
        do {
          if (lVar9 == 0) goto LAB_0010f696;
          pbVar4 = pbVar8 + lVar9;
          pbVar1 = (byte *)("true" + lVar9);
          lVar9 = lVar9 + -1;
        } while (*pbVar4 == *pbVar1);
      }
    }
    else {
      if (bVar3 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_0010f6ec;
      }
      if (bVar3 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_0010f6ec;
      }
    }
    goto switchD_0010f43d_caseD_23;
  }
  switch(bVar3) {
  case 0x22:
    token->type_ = tokenString;
    bVar7 = readString(this);
    goto LAB_0010f610;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
    break;
  case 0x27:
    if ((this->features_).allowSingleQuotes_ != true) goto switchD_0010f43d_caseD_2f;
    token->type_ = tokenString;
    bVar7 = readStringSingleQuote(this);
    goto LAB_0010f610;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_0010f6ec;
  case 0x2d:
    bVar7 = readNumber(this,true);
    if (bVar7) {
      token->type_ = tokenNumber;
      goto LAB_0010f6ec;
    }
    token->type_ = tokenNegInf;
    if (((this->features_).allowSpecialFloats_ == true) &&
       (pCVar5 = this->current_, 6 < (long)this->end_ - (long)pCVar5)) {
      lVar9 = 6;
      do {
        if (lVar9 == -1) {
          pbVar8 = (byte *)(pCVar5 + 7);
          goto LAB_0010f711;
        }
        pcVar2 = pCVar5 + lVar9;
        lVar6 = lVar9 + 2;
        lVar9 = lVar9 + -1;
      } while (*pcVar2 == "-Infinity"[lVar6]);
    }
    break;
  case 0x2f:
switchD_0010f43d_caseD_2f:
    token->type_ = tokenComment;
    bVar7 = readComment(this);
LAB_0010f610:
    if (bVar7 != false) goto LAB_0010f6ec;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this,false);
    goto LAB_0010f6ec;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_0010f6ec;
  case 0x49:
    if (((this->features_).allowSpecialFloats_ == true) &&
       (token->type_ = tokenPosInf, 6 < (long)pbVar4 - (long)pbVar1)) {
      lVar9 = 7;
      do {
        if (lVar9 == 0) {
          pbVar8 = pbVar8 + 8;
          goto LAB_0010f711;
        }
        pbVar4 = pbVar8 + lVar9;
        lVar6 = lVar9 + 1;
        lVar9 = lVar9 + -1;
      } while (*pbVar4 == "-Infinity"[lVar6]);
    }
    break;
  case 0x4e:
    if (((((this->features_).allowSpecialFloats_ == true) &&
         (token->type_ = tokenNaN, 1 < (long)pbVar4 - (long)pbVar1)) && (pbVar8[2] == 0x4e)) &&
       (*pbVar1 == 0x61)) {
      pbVar8 = pbVar8 + 3;
      goto LAB_0010f711;
    }
    break;
  default:
    if (bVar3 == 0) goto LAB_0010f536;
  }
switchD_0010f43d_caseD_23:
  token->type_ = tokenError;
LAB_0010f6ec:
  token->end_ = this->current_;
  return true;
LAB_0010f696:
  pbVar8 = pbVar8 + 4;
LAB_0010f711:
  this->current_ = (Location)pbVar8;
  goto LAB_0010f6ec;
}

Assistant:

bool OurReader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '\'':
    if (features_.allowSingleQuotes_) {
    token.type_ = tokenString;
    ok = readStringSingleQuote();
    break;
    } // else continue
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token.type_ = tokenNumber;
    readNumber(false);
    break;
  case '-':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenNegInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case 'N':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenNaN;
      ok = match("aN", 2);
    } else {
      ok = false;
    }
    break;
  case 'I':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenPosInf;
      ok = match("nfinity", 7);
    } else {
      ok = false;
    }
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}